

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *am,
          RRStepType brasteptype,RRStepType ketsteptype)

{
  _Rb_tree_header *p_Var1;
  _Type aiVar2;
  pointer pHVar3;
  _Rb_tree_node_base *p_Var4;
  mapped_type *pmVar5;
  _Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  pointer pHVar9;
  DoubletSet add_targets_1;
  HRRDoubletStepList brasteps;
  HRRDoubletStepList ketsteps;
  DoubletSet solvedbras;
  char *local_270;
  size_type local_268;
  char local_260;
  undefined7 uStack_25f;
  undefined8 uStack_258;
  char *local_250;
  size_type local_248;
  char local_240;
  undefined7 uStack_23f;
  undefined8 uStack_238;
  HRR_StepMap *local_230;
  DoubletSet initbras;
  DoubletSet targets;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  size_type local_1b8;
  char local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  size_type local_190;
  char local_188;
  undefined7 uStack_187;
  undefined8 uStack_180;
  DoubletSet solvedkets;
  DoubletSet prunedbra;
  DoubletSet prunedket;
  DoubletSet initkets;
  undefined1 local_b8 [40];
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_90;
  undefined1 local_60 [48];
  
  initkets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &initkets._M_t._M_impl.super__Rb_tree_header._M_header;
  initkets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  initkets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  initkets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  solvedkets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &solvedkets._M_t._M_impl.super__Rb_tree_header._M_header;
  solvedkets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  solvedkets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  solvedkets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  prunedket._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prunedket._M_t._M_impl.super__Rb_tree_header._M_header;
  prunedket._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prunedket._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prunedket._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(am->_M_t)._M_impl.super__Rb_tree_header;
  solvedkets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       solvedkets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  prunedket._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prunedket._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  initkets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       initkets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = (am->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    aiVar2 = (_Type)p_Var4[1]._M_parent;
    std::__cxx11::string::string((string *)&local_250,"",(allocator *)&initbras);
    if (local_250 == &local_240) {
      uStack_180 = uStack_238;
      local_198._M_p = &local_188;
    }
    else {
      local_198._M_p = local_250;
    }
    uStack_187 = uStack_23f;
    local_188 = local_240;
    local_190 = local_248;
    local_248 = 0;
    local_240 = '\0';
    local_250 = &local_240;
    local_1a0 = (undefined1  [8])aiVar2;
    GenerateDoubletTargets((DoubletSet *)&targets._M_t,(DAM *)local_1a0,KET);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_250);
    std::
    _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<Doublet>>
              ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                *)&initkets,
               (_Rb_tree_const_iterator<Doublet>)
               targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<Doublet>)&targets._M_t._M_impl.super__Rb_tree_header);
    std::
    _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
    ::~_Rb_tree(&targets._M_t);
  }
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::_Rb_tree(&targets._M_t,&initkets._M_t);
  PruneDoublets_(&targets,&prunedket,ketsteptype);
  ketsteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ketsteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ketsteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HRRDoubletLoop_(this,&ketsteps,&targets,&solvedkets,&prunedket,ketsteptype);
  std::
  __reverse<__gnu_cxx::__normal_iterator<HRRDoubletStep*,std::vector<HRRDoubletStep,std::allocator<HRRDoubletStep>>>>
            (ketsteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
             super__Vector_impl_data._M_start,
             ketsteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pHVar3 = ketsteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_230 = &this->ketsteps_;
  for (pHVar9 = ketsteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl
                .super__Vector_impl_data._M_start; pHVar9 != pHVar3; pHVar9 = pHVar9 + 1) {
    Doublet::amlist((DAM *)&initbras,&pHVar9->target);
    pmVar5 = std::
             map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
             ::operator[](local_230,(DAM *)&initbras);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back(pmVar5,pHVar9);
    std::__cxx11::string::~string((string *)&initbras._M_t._M_impl.super__Rb_tree_header);
    for (lVar8 = 0x48; lVar8 != 200; lVar8 = lVar8 + 0x40) {
      Doublet::amlist((DAM *)&initbras,&pHVar9->target);
      p_Var6 = &std::
                map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                ::operator[](&this->ketreq_,(DAM *)&initbras)->_M_t;
      Doublet::amlist((DAM *)&solvedbras,(Doublet *)((long)(&(pHVar9->target).left + -1) + lVar8));
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
      _M_insert_unique<DAM>(p_Var6,(DAM *)&solvedbras);
      std::__cxx11::string::~string((string *)&solvedbras._M_t._M_impl.super__Rb_tree_header);
      std::__cxx11::string::~string((string *)&initbras._M_t._M_impl.super__Rb_tree_header);
    }
  }
  initbras._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  initbras._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  initbras._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &initbras._M_t._M_impl.super__Rb_tree_header._M_header;
  initbras._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  solvedbras._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  solvedbras._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  solvedbras._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &solvedbras._M_t._M_impl.super__Rb_tree_header._M_header;
  solvedbras._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  prunedbra._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prunedbra._M_t._M_impl.super__Rb_tree_header._M_header;
  prunedbra._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prunedbra._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prunedbra._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  solvedbras._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       solvedbras._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  initbras._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       initbras._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  prunedbra._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prunedbra._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var7 = (am->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    aiVar2[0] = p_Var7[1]._M_color;
    aiVar2[1] = *(int *)&p_Var7[1].field_0x4;
    std::__cxx11::string::string((string *)&local_270,"",(allocator *)local_b8);
    if (local_270 == &local_260) {
      uStack_1a8 = uStack_258;
      local_1c0._M_p = &local_1b0;
    }
    else {
      local_1c0._M_p = local_270;
    }
    uStack_1af = uStack_25f;
    local_1b0 = local_260;
    local_1b8 = local_268;
    local_268 = 0;
    local_260 = '\0';
    local_270 = &local_260;
    local_1c8 = (undefined1  [8])aiVar2;
    GenerateDoubletTargets((DoubletSet *)&add_targets_1._M_t,(DAM *)local_1c8,BRA);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_270);
    std::
    _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<Doublet>>
              ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                *)&initbras,
               (_Rb_tree_const_iterator<Doublet>)
               add_targets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<Doublet>)&add_targets_1._M_t._M_impl.super__Rb_tree_header);
    std::
    _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
    ::~_Rb_tree(&add_targets_1._M_t);
  }
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::operator=(&targets._M_t,&initbras._M_t);
  PruneDoublets_(&targets,&prunedbra,brasteptype);
  brasteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  brasteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  brasteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HRRDoubletLoop_(this,&brasteps,&targets,&solvedbras,&prunedbra,brasteptype);
  std::
  __reverse<__gnu_cxx::__normal_iterator<HRRDoubletStep*,std::vector<HRRDoubletStep,std::allocator<HRRDoubletStep>>>>
            (brasteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
             super__Vector_impl_data._M_start,
             brasteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pHVar3 = brasteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pHVar9 = brasteps.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl
                .super__Vector_impl_data._M_start; pHVar9 != pHVar3; pHVar9 = pHVar9 + 1) {
    Doublet::amlist((DAM *)&add_targets_1,&pHVar9->target);
    pmVar5 = std::
             map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
             ::operator[](&this->brasteps_,(DAM *)&add_targets_1);
    std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back(pmVar5,pHVar9);
    std::__cxx11::string::~string((string *)&add_targets_1._M_t._M_impl.super__Rb_tree_header);
    for (lVar8 = 0x48; lVar8 != 200; lVar8 = lVar8 + 0x40) {
      Doublet::amlist((DAM *)&add_targets_1,&pHVar9->target);
      p_Var6 = &std::
                map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                ::operator[](&this->brareq_,(DAM *)&add_targets_1)->_M_t;
      Doublet::amlist((DAM *)local_b8,(Doublet *)((long)(&(pHVar9->target).left + -1) + lVar8));
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
      _M_insert_unique<DAM>(p_Var6,(DAM *)local_b8);
      std::__cxx11::string::~string((string *)(local_b8 + 8));
      std::__cxx11::string::~string((string *)&add_targets_1._M_t._M_impl.super__Rb_tree_header);
    }
  }
  for (p_Var7 = solvedbras._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &solvedbras._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    Doublet::amlist((DAM *)&add_targets_1,(Doublet *)(p_Var7 + 1));
    std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
    _M_insert_unique<DAM>(&(this->allbraam_)._M_t,(DAM *)&add_targets_1);
    std::__cxx11::string::~string((string *)&add_targets_1._M_t._M_impl.super__Rb_tree_header);
  }
  for (p_Var7 = solvedkets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &solvedkets._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    Doublet::amlist((DAM *)&add_targets_1,(Doublet *)(p_Var7 + 1));
    std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
    _M_insert_unique<DAM>(&(this->allketam_)._M_t,(DAM *)&add_targets_1);
    std::__cxx11::string::~string((string *)&add_targets_1._M_t._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::_Rb_tree
            (&local_90,&am->_M_t);
  AMOrder_AddWithDependencies_
            (this,&this->amorder_,&this->topqam_,&this->stepmap_,(QAMSet *)&local_90);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_90);
  for (p_Var4 = (this->topqam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->topqam_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    QAM::QAM((QAM *)local_60,(QAM *)(p_Var4 + 1));
    GenerateQuartetTargets((QuartetSet *)&add_targets_1,(QAM *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    std::
    _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<Quartet>>
              ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                *)&this->topquartets_,
               (_Rb_tree_const_iterator<Quartet>)
               add_targets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<Quartet>)&add_targets_1._M_t._M_impl.super__Rb_tree_header);
    std::
    _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
    ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                 *)&add_targets_1);
  }
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&brasteps);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&prunedbra._M_t);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&solvedbras._M_t);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&initbras._M_t);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&ketsteps);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&targets._M_t);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&prunedket._M_t);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&solvedkets._M_t);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&initkets._M_t);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(std::set<QAM> am,
                                      RRStepType brasteptype,
                                      RRStepType ketsteptype)
{
    // we need the kets from the original targets
    DoubletSet initkets, solvedkets, prunedket;

    for(auto & iam : am)
    {
        // strip of the tag here
        auto add_targets = GenerateDoubletTargets({iam[2],iam[3]}, DoubletType::KET);
        initkets.insert(add_targets.begin(), add_targets.end());
    }

    DoubletSet targets = initkets;
    PruneDoublets_(targets, prunedket, ketsteptype);

    //std::cout << "\n\n";
    //PrintDoubletSet(targets, "Initial ket targets");

    // Solve the ket part
    HRRDoubletStepList ketsteps;
    HRRDoubletLoop_(ketsteps, targets, solvedkets, prunedket, ketsteptype);
    std::reverse(ketsteps.begin(), ketsteps.end());

    // store in map by AM
    // and store requirements
    for(const auto & it : ketsteps)
    {
        ketsteps_[it.target.amlist()].push_back(it);
        for(const auto & it2 : it.src)
            ketreq_[it.target.amlist()].insert(it2.amlist());
    }
    

    /*
    std::cout << "\n\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    std::cout << "KET HRR step done.\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    for(const auto & it : ketsteps_)
    for(const auto & it2 : it.second)
        std::cout << it2 << "\n";
    */


    // we need the bras from the original targets
    DoubletSet initbras, solvedbras, prunedbra;
    for(auto & iam : am)
    {
        // this strips off the tag
        auto add_targets = GenerateDoubletTargets({iam[0],iam[1]}, DoubletType::BRA);
        initbras.insert(add_targets.begin(), add_targets.end());
    }


    // Initial bra targets
    targets = initbras;
    PruneDoublets_(targets, prunedbra, brasteptype);

    //std::cout << "\n\n";
    //PrintDoubletSet(targets, "Initial bra targets");

    // Solve the bra part
    HRRDoubletStepList brasteps;
    HRRDoubletLoop_(brasteps, targets, solvedbras, prunedbra, brasteptype);
    std::reverse(brasteps.begin(), brasteps.end());

    // store in map by AM
    // and store requirements
    for(const auto & it : brasteps)
    {
        brasteps_[it.target.amlist()].push_back(it);
        for(const auto & it2 : it.src)
            brareq_[it.target.amlist()].insert(it2.amlist());
    }


    /*
    std::cout << "\n\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    std::cout << "BRA HRR step done.\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    for(const auto & it : brasteps_)
    for(const auto & it2 : it.second)
        std::cout << it2 << "\n";
    */

    // solved info
    for(const auto & it : solvedbras)
        allbraam_.insert(it.amlist());
    for(const auto & it : solvedkets)
        allketam_.insert(it.amlist());

    // Put am in the order of calculation
    AMOrder_AddWithDependencies_(amorder_, topqam_, stepmap_, am);

    // form the top quartets
    for(auto & it : topqam_)
    {
        auto amquartets = GenerateQuartetTargets(it);
        topquartets_.insert(amquartets.begin(), amquartets.end());
    }

    //PrintQuartetSet(topquartets_, "HRR top quartets");
}